

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

SIMDShuffle * __thiscall
wasm::Builder::makeSIMDShuffle
          (Builder *this,Expression *left,Expression *right,array<unsigned_char,_16UL> *mask)

{
  undefined8 uVar1;
  SIMDShuffle *this_00;
  
  this_00 = MixedArena::alloc<wasm::SIMDShuffle>(&this->wasm->allocator);
  this_00->left = left;
  this_00->right = right;
  uVar1 = *(undefined8 *)(mask->_M_elems + 8);
  *(undefined8 *)(this_00->mask)._M_elems = *(undefined8 *)mask->_M_elems;
  *(undefined8 *)((this_00->mask)._M_elems + 8) = uVar1;
  SIMDShuffle::finalize(this_00);
  return this_00;
}

Assistant:

SIMDShuffle* makeSIMDShuffle(Expression* left,
                               Expression* right,
                               const std::array<uint8_t, 16>& mask) {
    auto* ret = wasm.allocator.alloc<SIMDShuffle>();
    ret->left = left;
    ret->right = right;
    ret->mask = mask;
    ret->finalize();
    return ret;
  }